

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

int despot::Variable::ComputeCurrentIndex
              (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *vars)

{
  pointer ppNVar1;
  NamedVar *pNVar2;
  int iVar3;
  int i;
  long lVar4;
  
  ppNVar1 = (vars->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  iVar3 = 0;
  for (lVar4 = 0;
      (long)(vars->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3 != lVar4;
      lVar4 = lVar4 + 1) {
    pNVar2 = ppNVar1[lVar4];
    iVar3 = iVar3 * (int)((ulong)((long)*(pointer *)
                                         ((long)&(pNVar2->super_Variable).values_.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         + 8) -
                                 *(long *)&(pNVar2->super_Variable).values_.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data) >> 5) +
            (pNVar2->super_Variable).curr_value;
  }
  return iVar3;
}

Assistant:

int Variable::ComputeCurrentIndex(const vector<NamedVar*>& vars) {
	int index = 0;
	for (int i = 0; i < vars.size(); i++) {
		NamedVar* var = vars[i];
		index = index * var->Size() + var->curr_value;
	}
	return index;
}